

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O1

Comparison
Kernel::RationalConstantType::comparePrecedence(RationalConstantType *n1,RationalConstantType *n2)

{
  Comparison CVar1;
  IntegerConstantType local_60;
  IntegerConstantType local_50;
  IntegerConstantType local_40;
  IntegerConstantType local_30;
  
  IntegerConstantType::IntegerConstantType(&local_50,&n1->_den);
  IntegerConstantType::IntegerConstantType(&local_30,&n2->_den);
  CVar1 = IntegerConstantType::comparePrecedence(&local_50,&local_30);
  if ((long)local_30._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_30._val[0]._mp_d,(long)local_30._val[0]._mp_alloc << 3);
  }
  if ((long)local_50._val[0]._mp_alloc != 0) {
    (*gmp_free_func)(local_50._val[0]._mp_d,(long)local_50._val[0]._mp_alloc << 3);
  }
  if (CVar1 == EQUAL) {
    IntegerConstantType::IntegerConstantType(&local_60,&n1->_num);
    IntegerConstantType::IntegerConstantType(&local_40,&n2->_num);
    CVar1 = IntegerConstantType::comparePrecedence(&local_60,&local_40);
    if ((long)local_40._val[0]._mp_alloc != 0) {
      (*gmp_free_func)(local_40._val[0]._mp_d,(long)local_40._val[0]._mp_alloc << 3);
    }
    if ((long)local_60._val[0]._mp_alloc != 0) {
      (*gmp_free_func)(local_60._val[0]._mp_d,(long)local_60._val[0]._mp_alloc << 3);
    }
  }
  return CVar1;
}

Assistant:

Comparison RationalConstantType::comparePrecedence(RationalConstantType n1, RationalConstantType n2)
{
  auto prec = IntegerConstantType::comparePrecedence(n1._den, n2._den);
  if (prec != EQUAL) return prec;
  return IntegerConstantType::comparePrecedence(n1._num, n2._num);
}